

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O2

size_t ZSTD_getcBlockSize(void *src,size_t srcSize,blockProperties_t *bpPtr)

{
  ushort uVar1;
  uint3 uVar2;
  blockType_e bVar3;
  blockType_e bVar4;
  size_t sStack_8;
  
  if (srcSize < 3) {
    sStack_8 = 0xffffffffffffffb8;
  }
  else {
    uVar1 = *src;
    uVar2 = *src;
    bpPtr->lastBlock = uVar1 & 1;
    bVar4 = uVar1 >> 1 & bt_reserved;
    bpPtr->blockType = bVar4;
    bpPtr->origSize = (uint)(uVar2 >> 3);
    bVar3 = bVar4;
    if ((bVar4 == bt_rle) || (bVar3 = (uint)(uVar2 >> 3), bVar4 != bt_reserved)) {
      return (ulong)bVar3;
    }
    sStack_8 = 0xffffffffffffffec;
  }
  return sStack_8;
}

Assistant:

size_t ZSTD_getcBlockSize(const void* src, size_t srcSize,
                          blockProperties_t* bpPtr)
{
    if (srcSize < ZSTD_blockHeaderSize) return ERROR(srcSize_wrong);
    {   U32 const cBlockHeader = MEM_readLE24(src);
        U32 const cSize = cBlockHeader >> 3;
        bpPtr->lastBlock = cBlockHeader & 1;
        bpPtr->blockType = (blockType_e)((cBlockHeader >> 1) & 3);
        bpPtr->origSize = cSize;   /* only useful for RLE */
        if (bpPtr->blockType == bt_rle) return 1;
        if (bpPtr->blockType == bt_reserved) return ERROR(corruption_detected);
        return cSize;
    }
}